

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

void print<std::queue<int,std::__cxx11::list<int,std::allocator<int>>>>
               (queue<int,_std::__cxx11::list<int,_std::allocator<int>_>_> *t,char *s)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  long lVar3;
  undefined8 in_RAX;
  size_t sVar4;
  ostream *this;
  undefined8 uStack_38;
  
  lVar3 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar3 + -0x18) + 0x10c098);
  }
  else {
    sVar4 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next != (_List_node_base *)t) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::ostream::operator<<
                (this,*(int *)&(t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                               super__List_node_base._M_next[1]._M_next);
      p_Var2 = (t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next;
      psVar1 = &(t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var2,0x18);
    } while ((t->c).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next != (_List_node_base *)t);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}